

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O1

void __thiscall Fl_Widget::hide(Fl_Widget *this)

{
  Fl_Group *pFVar1;
  Fl_Group *this_00;
  
  pFVar1 = (Fl_Group *)this;
  if ((this->flags_ & 2) == 0) {
    do {
      pFVar1 = *(Fl_Group **)((long)&pFVar1->super_Fl_Widget + 8);
      if (pFVar1 == (Fl_Group *)0x0) goto LAB_001dd30b;
    } while (((pFVar1->super_Fl_Widget).flags_ & 2) == 0);
    if (pFVar1 == (Fl_Group *)0x0) {
LAB_001dd30b:
      *(byte *)&this->flags_ = (byte)this->flags_ | 2;
      pFVar1 = this->parent_;
      do {
        this_00 = pFVar1;
        if (this_00 == (Fl_Group *)0x0) goto LAB_001dd32f;
      } while ((*(uchar *)((long)&this_00->super_Fl_Widget + 0x6e) == '\0') &&
              (pFVar1 = *(Fl_Group **)((long)&this_00->super_Fl_Widget + 8),
              *(Fl_Group **)((long)&this_00->super_Fl_Widget + 8) != (Fl_Group *)0x0));
      redraw(&this_00->super_Fl_Widget);
LAB_001dd32f:
      (*this->_vptr_Fl_Widget[3])(this,0xf);
      fl_throw_focus(this);
      return;
    }
  }
  *(byte *)&this->flags_ = (byte)this->flags_ | 2;
  return;
}

Assistant:

void Fl_Widget::hide() {
  if (visible_r()) {
    set_flag(INVISIBLE);
    for (Fl_Widget *p = parent(); p; p = p->parent())
      if (p->box() || !p->parent()) {p->redraw(); break;}
    handle(FL_HIDE);
    fl_throw_focus(this);
  } else {
    set_flag(INVISIBLE);
  }
}